

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_key_helpers.hpp
# Opt level: O0

void duckdb::AggregateSortKeyHelpers::
     UnaryUpdate<duckdb::QuantileState<duckdb::string_t,duckdb::QuantileStringType>,duckdb::QuantileListFallback,(duckdb::OrderType)2,true>
               (Vector *inputs,AggregateInputData *input_data,idx_t input_count,Vector *state_vector
               ,idx_t count)

{
  QuantileState<duckdb::string_t,_duckdb::QuantileStringType> **ppQVar1;
  idx_t iVar2;
  ulong in_RCX;
  Vector *in_RDI;
  UnifiedVectorFormat *in_R8;
  QuantileState<duckdb::string_t,_duckdb::QuantileStringType> *state;
  idx_t key_idx;
  idx_t idx;
  idx_t sidx;
  idx_t i;
  QuantileState<duckdb::string_t,_duckdb::QuantileStringType> **states;
  string_t *key_data;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat kdata;
  UnifiedVectorFormat idata;
  OrderModifiers modifiers;
  Vector sort_key;
  Vector *input;
  undefined7 in_stack_fffffffffffffe20;
  undefined1 in_stack_fffffffffffffe27;
  TemplatedValidityMask<unsigned_long> *this;
  UnifiedVectorFormat *local_1b0;
  SelectionVector *local_198 [9];
  SelectionVector *local_150 [9];
  SelectionVector *local_108 [9];
  OrderModifiers local_c0;
  OrderModifiers local_be [7];
  undefined1 local_b0 [128];
  Vector *local_30;
  UnifiedVectorFormat *local_28;
  ulong local_20;
  
  this = (TemplatedValidityMask<unsigned_long> *)local_b0;
  local_30 = in_RDI;
  local_28 = in_R8;
  local_20 = in_RCX;
  duckdb::LogicalType::LogicalType((LogicalType *)this,BLOB);
  duckdb::Vector::Vector((Vector *)(local_b0 + 0x18),this,0x800);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_b0);
  OrderModifiers::OrderModifiers(local_be,ASCENDING,NULLS_LAST);
  local_c0 = local_be[0];
  duckdb::CreateSortKeyHelpers::CreateSortKey
            (local_30,(ulong)local_28,local_be[0],(Vector *)(local_b0 + 0x18));
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_108);
  duckdb::Vector::ToUnifiedFormat((ulong)local_30,local_28);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_150);
  duckdb::Vector::ToUnifiedFormat((ulong)(local_b0 + 0x18),local_28);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_198);
  duckdb::Vector::ToUnifiedFormat(local_20,local_28);
  UnifiedVectorFormat::GetData<duckdb::string_t>((UnifiedVectorFormat *)local_150);
  ppQVar1 = UnifiedVectorFormat::
            GetData<duckdb::QuantileState<duckdb::string_t,duckdb::QuantileStringType>*>
                      ((UnifiedVectorFormat *)local_198);
  for (local_1b0 = (UnifiedVectorFormat *)0x0; local_1b0 < local_28; local_1b0 = local_1b0 + 1) {
    iVar2 = SelectionVector::get_index(local_198[0],(idx_t)local_1b0);
    SelectionVector::get_index(local_108[0],(idx_t)local_1b0);
    in_stack_fffffffffffffe27 =
         TemplatedValidityMask<unsigned_long>::RowIsValid
                   (this,CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
    if ((bool)in_stack_fffffffffffffe27) {
      SelectionVector::get_index(local_150[0],(idx_t)local_1b0);
      QuantileListFallback::
      Execute<duckdb::string_t,duckdb::QuantileState<duckdb::string_t,duckdb::QuantileStringType>,duckdb::QuantileListFallback>
                (ppQVar1[iVar2],(string_t *)this,
                 (AggregateInputData *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20)
                );
    }
  }
  UnifiedVectorFormat::~UnifiedVectorFormat
            ((UnifiedVectorFormat *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
  UnifiedVectorFormat::~UnifiedVectorFormat
            ((UnifiedVectorFormat *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
  UnifiedVectorFormat::~UnifiedVectorFormat
            ((UnifiedVectorFormat *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
  Vector::~Vector((Vector *)CONCAT17(in_stack_fffffffffffffe27,in_stack_fffffffffffffe20));
  return;
}

Assistant:

static void UnaryUpdate(Vector inputs[], AggregateInputData &input_data, idx_t input_count, Vector &state_vector,
	                        idx_t count) {
		D_ASSERT(input_count == 1);
		auto &input = inputs[0];

		Vector sort_key(LogicalType::BLOB);
		auto modifiers = OrderModifiers(ORDER_TYPE, OrderByNullType::NULLS_LAST);
		CreateSortKeyHelpers::CreateSortKey(input, count, modifiers, sort_key);

		UnifiedVectorFormat idata;
		if (IGNORE_NULLS) {
			input.ToUnifiedFormat(count, idata);
		}

		UnifiedVectorFormat kdata;
		sort_key.ToUnifiedFormat(count, kdata);

		UnifiedVectorFormat sdata;
		state_vector.ToUnifiedFormat(count, sdata);

		auto key_data = UnifiedVectorFormat::GetData<string_t>(kdata);
		auto states = UnifiedVectorFormat::GetData<STATE *>(sdata);
		for (idx_t i = 0; i < count; i++) {
			const auto sidx = sdata.sel->get_index(i);
			if (IGNORE_NULLS) {
				auto idx = idata.sel->get_index(i);
				if (!idata.validity.RowIsValid(idx)) {
					continue;
				}
			}
			const auto key_idx = kdata.sel->get_index(i);
			auto &state = *states[sidx];
			OP::template Execute<string_t, STATE, OP>(state, key_data[key_idx], input_data);
		}
	}